

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O0

void NULLCCanvas::CanvasDrawRectA(int x1,int y1,int x2,int y2,double alpha,Canvas *ptr)

{
  float *pfVar1;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  float *pixel;
  int ye;
  int y;
  int xe;
  int x;
  Canvas *ptr_local;
  double alpha_local;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  
  if (ptr == (Canvas *)0x0) {
    nullcThrowError("ERROR: Canvas object is nullptr");
  }
  else {
    local_44 = x1;
    if (x1 < 0) {
      local_44 = 0;
    }
    y = local_44;
    local_48 = x2;
    if (ptr->width < x2) {
      local_48 = ptr->width;
    }
    for (; y < local_48; y = y + 1) {
      local_4c = y1;
      if (y1 < 0) {
        local_4c = 0;
      }
      pixel._4_4_ = local_4c;
      local_50 = y2;
      if (ptr->height < y2) {
        local_50 = ptr->height;
      }
      for (; pixel._4_4_ < local_50; pixel._4_4_ = pixel._4_4_ + 1) {
        pfVar1 = (float *)((ptr->data).ptr + (long)(pixel._4_4_ * ptr->width * 4 + y * 4) * 4);
        *pfVar1 = (float)((double)ptr->color[0] * alpha + (double)*pfVar1 * (1.0 - alpha));
        pfVar1[1] = (float)((double)ptr->color[1] * alpha + (double)pfVar1[1] * (1.0 - alpha));
        pfVar1[2] = (float)((double)ptr->color[2] * alpha + (double)pfVar1[2] * (1.0 - alpha));
        pfVar1[3] = 1.0;
      }
    }
  }
  return;
}

Assistant:

void CanvasDrawRectA(int x1, int y1, int x2, int y2, double alpha, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		for(int x = x1 < 0 ? 0 : x1, xe = x2 > ptr->width ? ptr->width : x2; x < xe; x++)
		{
			for(int y = y1 < 0 ? 0 : y1, ye = y2 > ptr->height ? ptr->height : y2; y < ye; y++)
			{
				float *pixel = &((float*)ptr->data.ptr)[y * ptr->width * 4 + x * 4];

				pixel[0] = float(ptr->color[0] * alpha + pixel[0] * (1.0 - alpha));
				pixel[1] = float(ptr->color[1] * alpha + pixel[1] * (1.0 - alpha));
				pixel[2] = float(ptr->color[2] * alpha + pixel[2] * (1.0 - alpha));
				pixel[3] = 1.0f;
			}
		}
	}